

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt tt_cmap14_char_map_def_binary(FT_Byte *base,FT_UInt32 char_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = *(uint *)base;
  uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = 0;
  do {
    if (uVar2 <= uVar3) {
      return 0;
    }
    uVar4 = uVar2 + uVar3 >> 1;
    uVar5 = (ulong)(uVar4 * 4);
    uVar6 = (uint)base[uVar5 + 6] | (uint)base[uVar5 + 5] << 8 | (uint)base[uVar5 + 4] << 0x10;
    bVar7 = true;
    uVar1 = uVar4;
    if ((uVar6 <= char_code) &&
       (uVar6 = uVar6 + base[uVar5 + 7], bVar7 = uVar6 < char_code, uVar1 = uVar2, uVar6 < char_code
       )) {
      uVar3 = uVar4 + 1;
    }
    uVar2 = uVar1;
  } while (bVar7);
  return 1;
}

Assistant:

static FT_UInt
  tt_cmap14_char_map_def_binary( FT_Byte    *base,
                                 FT_UInt32   char_code )
  {
    FT_UInt32  numRanges = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numRanges;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid   = ( min + max ) >> 1;
      FT_Byte*   p     = base + 4 * mid;
      FT_ULong   start = TT_NEXT_UINT24( p );
      FT_UInt    cnt   = FT_NEXT_BYTE( p );


      if ( char_code < start )
        max = mid;
      else if ( char_code > start + cnt )
        min = mid + 1;
      else
        return TRUE;
    }

    return FALSE;
  }